

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::v_formatter<spdlog::details::null_scoped_padder>::format
          (v_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  char *__src;
  size_t __n;
  ptrdiff_t _Num;
  char *buf_ptr;
  ulong uVar1;
  
  __src = (msg->payload).data_;
  if (__src != (char *)0x0) {
    __n = (msg->payload).size_;
    uVar1 = (dest->super_buffer<char>).size_ + __n;
    if ((dest->super_buffer<char>).capacity_ < uVar1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar1);
    }
    if (__n != 0) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,__n);
    }
    (dest->super_buffer<char>).size_ = uVar1;
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        ScopedPadder p(msg.payload.size(), padinfo_, dest);
        fmt_helper::append_string_view(msg.payload, dest);
    }